

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O0

void __thiscall Assimp::Ogre::MeshXml::Reset(MeshXml *this)

{
  Skeleton *this_00;
  VertexDataXml *this_01;
  SubMeshXml *this_02;
  bool bVar1;
  reference ppSVar2;
  SubMeshXml **mesh;
  iterator __end2;
  iterator __begin2;
  SubMeshXmlList *__range2;
  MeshXml *this_local;
  
  this_00 = this->skeleton;
  if (this_00 != (Skeleton *)0x0) {
    Skeleton::~Skeleton(this_00);
    operator_delete(this_00,0x38);
  }
  this->skeleton = (Skeleton *)0x0;
  this_01 = this->sharedVertexData;
  if (this_01 != (VertexDataXml *)0x0) {
    VertexDataXml::~VertexDataXml(this_01);
    operator_delete(this_01,0xe0);
  }
  this->sharedVertexData = (VertexDataXml *)0x0;
  __end2 = std::vector<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>::
           begin(&this->subMeshes);
  mesh = (SubMeshXml **)
         std::vector<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>::end
                   (&this->subMeshes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<Assimp::Ogre::SubMeshXml_**,_std::vector<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>_>
                                *)&mesh);
    if (!bVar1) break;
    ppSVar2 = __gnu_cxx::
              __normal_iterator<Assimp::Ogre::SubMeshXml_**,_std::vector<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>_>
              ::operator*(&__end2);
    this_02 = *ppSVar2;
    if (this_02 != (SubMeshXml *)0x0) {
      SubMeshXml::~SubMeshXml(this_02);
      operator_delete(this_02,0xa8);
    }
    *ppSVar2 = (SubMeshXml *)0x0;
    __gnu_cxx::
    __normal_iterator<Assimp::Ogre::SubMeshXml_**,_std::vector<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>_>
    ::operator++(&__end2);
  }
  std::vector<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>::clear
            (&this->subMeshes);
  return;
}

Assistant:

void MeshXml::Reset()
{
    OGRE_SAFE_DELETE(skeleton)
    OGRE_SAFE_DELETE(sharedVertexData)

    for(auto &mesh : subMeshes) {
        OGRE_SAFE_DELETE(mesh)
    }
    subMeshes.clear();
}